

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O1

void fio_cluster_server_handler(cluster_pr_s *pr)

{
  uintptr_t *puVar1;
  fio_sub_hash_couplet_s *pfVar2;
  fio_lock_i fVar3;
  uint32_t uVar4;
  size_t sVar5;
  char *pcVar6;
  _func_void_void_ptr *p_Var7;
  fio_sub_hash__ordered_s_ *pfVar8;
  fio_msg_internal_s *pfVar9;
  ulong uVar10;
  fio_str_s key;
  fio_str_s key_00;
  fio_sub_hash_couplet_s obj;
  fio_sub_hash_couplet_s obj_00;
  undefined6 uVar11;
  subscribe_args_s args;
  subscribe_args_s args_00;
  uint64_t uVar12;
  fio_sub_hash__map_s_ *pfVar13;
  uintptr_t uVar14;
  subscription_s *psVar15;
  fio_sub_hash__ordered_s_ *pfVar16;
  long lVar17;
  subscription_s **ppsVar18;
  size_t *psVar19;
  size_t *psVar20;
  fio_lock_i ret_1;
  fio_lock_i ret;
  timespec local_158;
  undefined4 local_148;
  undefined4 uStack_144;
  size_t sStack_140;
  code *local_138;
  char *pcStack_130;
  undefined8 local_128;
  uint local_118;
  undefined4 local_110;
  __time_t local_108;
  long in_stack_ffffffffffffff00;
  undefined8 in_stack_ffffffffffffff08;
  undefined3 in_stack_ffffffffffffff10;
  undefined5 in_stack_ffffffffffffff13;
  undefined3 in_stack_ffffffffffffff18;
  undefined8 in_stack_ffffffffffffff1b;
  undefined5 in_stack_ffffffffffffff23;
  undefined8 in_stack_ffffffffffffff28;
  undefined8 uVar21;
  undefined2 in_stack_ffffffffffffff30;
  undefined2 uVar22;
  undefined6 in_stack_ffffffffffffff32;
  undefined8 in_stack_ffffffffffffff38;
  undefined2 in_stack_ffffffffffffff40;
  undefined6 in_stack_ffffffffffffff42;
  size_t local_b8 [3];
  char *local_a0;
  ulong local_98;
  code *local_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  size_t local_70 [3];
  char *local_58;
  undefined8 local_50;
  code *local_48;
  undefined8 local_40;
  undefined8 uStack_38;
  undefined8 local_30;
  
  switch(pr->type) {
  case 0:
  case 1:
    pfVar9 = pr->msg;
    LOCK();
    puVar1 = &pfVar9->ref;
    *puVar1 = *puVar1 + 1;
    UNLOCK();
    fio_cluster_server_sender(pfVar9,pr->uuid);
    break;
  case 2:
    break;
  case 3:
    pr->type = 1;
    break;
  case 4:
    local_70[0]._0_4_ = 0;
    pfVar9 = pr->msg;
    local_58 = (pfVar9->channel).data;
    local_70[1] = (pfVar9->channel).capa;
    local_70[2] = (pfVar9->channel).len;
    local_50 = 0;
    local_48 = fio_mock_on_message;
    local_40 = 0;
    uStack_38 = 0;
    local_30 = 0;
    psVar19 = local_70;
    psVar20 = (size_t *)&stack0xfffffffffffffe58;
    for (lVar17 = 9; lVar17 != 0; lVar17 = lVar17 + -1) {
      *psVar20 = *psVar19;
      psVar19 = psVar19 + 1;
      psVar20 = psVar20 + 1;
    }
    args.channel.capa = in_stack_ffffffffffffff08;
    args._0_8_ = in_stack_ffffffffffffff00;
    args.channel.len._0_3_ = in_stack_ffffffffffffff10;
    args.channel.len._3_5_ = in_stack_ffffffffffffff13;
    args.channel.data._0_3_ = in_stack_ffffffffffffff18;
    args._27_8_ = in_stack_ffffffffffffff1b;
    args.match._3_5_ = in_stack_ffffffffffffff23;
    args.on_message = (_func_void_fio_msg_s_ptr *)in_stack_ffffffffffffff28;
    args.on_unsubscribe._0_2_ = in_stack_ffffffffffffff30;
    args.on_unsubscribe._2_6_ = in_stack_ffffffffffffff32;
    args.udata1 = (void *)in_stack_ffffffffffffff38;
    args.udata2._0_2_ = in_stack_ffffffffffffff40;
    args.udata2._2_6_ = in_stack_ffffffffffffff42;
    psVar15 = fio_subscribe(args);
    local_158.tv_sec._0_4_ = 0;
    local_158.tv_sec._4_2_ = 0;
    local_158.tv_sec._6_2_ = 0;
    local_158.tv_nsec._0_4_ = 0;
    local_158.tv_nsec._4_2_ = 0;
    local_158.tv_nsec._6_2_ = 0;
    local_148 = 0;
    uStack_144 = 0;
    sStack_140 = (pr->msg->channel).len;
    local_138 = fio_free;
    pcStack_130 = (pr->msg->channel).data;
    LOCK();
    fVar3 = pr->lock;
    pr->lock = '\x01';
    UNLOCK();
    local_108 = CONCAT71(local_108._1_7_,fVar3);
    if (fVar3 != '\0') {
      do {
        local_108 = 0;
        nanosleep((timespec *)&local_108,(timespec *)0x0);
        LOCK();
        fVar3 = pr->lock;
        pr->lock = '\x01';
        UNLOCK();
        local_108 = CONCAT71(local_108._1_7_,fVar3);
      } while (fVar3 != '\0');
    }
    ppsVar18 = (subscription_s **)0x3;
    uVar12 = fio_siphash_xy((pr->msg->channel).data,(pr->msg->channel).len,1,3,0x18bb68,0x18bb68);
    key.small = local_158.tv_sec._4_1_;
    key.frozen = local_158.tv_sec._5_1_;
    key.ref = (uint)local_158.tv_sec;
    key.reserved[0] = local_158.tv_sec._6_1_;
    key.reserved[1] = local_158.tv_sec._7_1_;
    key.reserved[6] = local_158.tv_nsec._4_1_;
    key.reserved[7] = local_158.tv_nsec._5_1_;
    key.reserved[2] = (undefined1)local_158.tv_nsec;
    key.reserved[3] = local_158.tv_nsec._1_1_;
    key.reserved[4] = local_158.tv_nsec._2_1_;
    key.reserved[5] = local_158.tv_nsec._3_1_;
    key.reserved[8] = local_158.tv_nsec._6_1_;
    key.reserved[9] = local_158.tv_nsec._7_1_;
    key.capa._4_4_ = uStack_144;
    key.capa._0_4_ = local_148;
    key.len = sStack_140;
    key.dealloc = local_138;
    key.data = pcStack_130;
    fio_sub_hash_insert(&pr->pubsub,uVar12,key,psVar15,ppsVar18);
    goto LAB_0013d29e;
  case 5:
    local_118 = 0;
    uVar21 = 0;
    uVar22 = 0;
    sVar5 = (pr->msg->channel).len;
    pcVar6 = (pr->msg->channel).data;
    LOCK();
    fVar3 = pr->lock;
    pr->lock = '\x01';
    UNLOCK();
    local_158.tv_sec._0_4_ = CONCAT31(local_158.tv_sec._1_3_,fVar3);
    if (fVar3 != '\0') {
      do {
        local_158.tv_sec._0_4_ = 0;
        local_158.tv_sec._4_2_ = 0;
        local_158.tv_sec._6_2_ = 0;
        local_158.tv_nsec._0_4_ = 1;
        local_158.tv_nsec._4_2_ = 0;
        local_158.tv_nsec._6_2_ = 0;
        nanosleep(&local_158,(timespec *)0x0);
        LOCK();
        fVar3 = pr->lock;
        pr->lock = '\x01';
        UNLOCK();
        local_158.tv_sec._0_4_ = CONCAT31(local_158.tv_sec._1_3_,fVar3);
      } while (fVar3 != '\0');
    }
    uVar12 = fio_siphash_xy((pr->msg->channel).data,(pr->msg->channel).len,1,3,0x18bb68,0x18bb68);
    local_158.tv_nsec._6_2_ = uVar22;
    local_158.tv_sec._0_4_ = local_118;
    local_158.tv_sec._4_2_ = 0;
    local_158.tv_sec._6_2_ = (undefined2)uVar21;
    local_158.tv_nsec._0_4_ = (undefined4)((ulong)uVar21 >> 0x10);
    local_158.tv_nsec._4_2_ = (undefined2)((ulong)uVar21 >> 0x30);
    local_148 = 0;
    uStack_144 = 0;
    local_138 = fio_free;
    local_128 = 0;
    obj_00.key.small = '\0';
    obj_00.key.frozen = '\0';
    obj_00.key.ref = local_118;
    obj_00.key.reserved[0] = local_158.tv_sec._6_1_;
    obj_00.key.reserved[1] = local_158.tv_sec._7_1_;
    uVar11 = (undefined6)((ulong)uVar21 >> 0x10);
    obj_00.key.reserved[8] = (char)local_158.tv_nsec._6_2_;
    obj_00.key.reserved[9] = (char)((ushort)local_158.tv_nsec._6_2_ >> 8);
    obj_00.key.reserved[2] = (char)uVar11;
    obj_00.key.reserved[3] = (char)((uint6)uVar11 >> 8);
    obj_00.key.reserved[4] = (char)((uint6)uVar11 >> 0x10);
    obj_00.key.reserved[5] = (char)((uint6)uVar11 >> 0x18);
    obj_00.key.reserved[6] = (char)((uint6)uVar11 >> 0x20);
    obj_00.key.reserved[7] = (char)((uint6)uVar11 >> 0x28);
    obj_00.key.capa = 0;
    obj_00.key.len = sVar5;
    obj_00.key.dealloc = fio_free;
    obj_00.key.data = pcVar6;
    obj_00.obj = (subscription_s *)0x0;
    sStack_140 = sVar5;
    pcStack_130 = pcVar6;
    pfVar13 = fio_sub_hash__find_map_pos_(&pr->pubsub,uVar12,obj_00);
    if ((pfVar13 != (fio_sub_hash__map_s_ *)0x0) &&
       (pfVar16 = pfVar13->pos, pfVar16 != (fio_sub_hash__ordered_s_ *)0x0)) {
      LOCK();
      pfVar2 = &pfVar16->obj;
      uVar4 = (pfVar2->key).ref;
      (pfVar2->key).ref = (pfVar2->key).ref - 1;
      UNLOCK();
      if (uVar4 == 0) {
        if (((pfVar16->obj).key.small == '\0') &&
           (p_Var7 = (pfVar16->obj).key.dealloc, p_Var7 != (_func_void_void_ptr *)0x0)) {
          (*p_Var7)((pfVar16->obj).key.data);
        }
        local_110 = 0;
        local_108 = 0;
        (pfVar16->obj).key.ref = 0;
        (pfVar16->obj).key.small = '\x01';
        memcpy(&(pfVar16->obj).key.frozen,&local_108,0x2b);
      }
      fio_unsubscribe((pfVar13->pos->obj).obj);
      (pr->pubsub).count = (pr->pubsub).count - 1;
      pfVar8 = pfVar13->pos;
      pfVar8->hash = 0;
      uVar14 = (pr->pubsub).pos;
      pfVar16 = (pr->pubsub).ordered;
      if (pfVar8 == pfVar16 + (uVar14 - 1)) {
        pfVar13->hash = 0;
        pfVar16 = pfVar16 + (uVar14 - 2);
        do {
          if (uVar14 == 1) {
            uVar14 = 0;
            break;
          }
          uVar14 = uVar14 - 1;
          puVar1 = &pfVar16->hash;
          pfVar16 = pfVar16 + -1;
        } while (*puVar1 == 0);
        (pr->pubsub).pos = uVar14;
      }
      pfVar13->pos = (fio_sub_hash__ordered_s_ *)0x0;
    }
    goto LAB_0013d2d7;
  case 6:
    pfVar9 = pr->msg;
    uVar10 = *(ulong *)(pfVar9->data).data;
    local_b8[0]._0_4_ = 0;
    local_b8[1] = (pfVar9->channel).capa;
    local_b8[2] = (pfVar9->channel).len;
    local_a0 = (pfVar9->channel).data;
    local_98 = uVar10 >> 0x38 | (uVar10 & 0xff000000000000) >> 0x28 |
               (uVar10 & 0xff0000000000) >> 0x18 | (uVar10 & 0xff00000000) >> 8 |
               (uVar10 & 0xff000000) << 8 | (uVar10 & 0xff0000) << 0x18 | (uVar10 & 0xff00) << 0x28
               | uVar10 << 0x38;
    local_90 = fio_mock_on_message;
    local_88 = 0;
    uStack_80 = 0;
    local_78 = 0;
    psVar19 = local_b8;
    psVar20 = (size_t *)&stack0xfffffffffffffe58;
    for (lVar17 = 9; lVar17 != 0; lVar17 = lVar17 + -1) {
      *psVar20 = *psVar19;
      psVar19 = psVar19 + 1;
      psVar20 = psVar20 + 1;
    }
    args_00.channel.capa = in_stack_ffffffffffffff08;
    args_00._0_8_ = in_stack_ffffffffffffff00;
    args_00.channel.len._0_3_ = in_stack_ffffffffffffff10;
    args_00.channel.len._3_5_ = in_stack_ffffffffffffff13;
    args_00.channel.data._0_3_ = in_stack_ffffffffffffff18;
    args_00._27_8_ = in_stack_ffffffffffffff1b;
    args_00.match._3_5_ = in_stack_ffffffffffffff23;
    args_00.on_message = (_func_void_fio_msg_s_ptr *)in_stack_ffffffffffffff28;
    args_00.on_unsubscribe._0_2_ = in_stack_ffffffffffffff30;
    args_00.on_unsubscribe._2_6_ = in_stack_ffffffffffffff32;
    args_00.udata1 = (void *)in_stack_ffffffffffffff38;
    args_00.udata2._0_2_ = in_stack_ffffffffffffff40;
    args_00.udata2._2_6_ = in_stack_ffffffffffffff42;
    psVar15 = fio_subscribe(args_00);
    local_158.tv_sec._0_4_ = 0;
    local_158.tv_sec._4_2_ = 0;
    local_158.tv_sec._6_2_ = 0;
    local_158.tv_nsec._0_4_ = 0;
    local_158.tv_nsec._4_2_ = 0;
    local_158.tv_nsec._6_2_ = 0;
    local_148 = 0;
    uStack_144 = 0;
    sStack_140 = (pr->msg->channel).len;
    local_138 = fio_free;
    pcStack_130 = (pr->msg->channel).data;
    LOCK();
    fVar3 = pr->lock;
    pr->lock = '\x01';
    UNLOCK();
    local_108 = CONCAT71(local_108._1_7_,fVar3);
    if (fVar3 != '\0') {
      do {
        local_108 = 0;
        nanosleep((timespec *)&local_108,(timespec *)0x0);
        LOCK();
        fVar3 = pr->lock;
        pr->lock = '\x01';
        UNLOCK();
        local_108 = CONCAT71(local_108._1_7_,fVar3);
      } while (fVar3 != '\0');
    }
    ppsVar18 = (subscription_s **)0x3;
    uVar12 = fio_siphash_xy((pr->msg->channel).data,(pr->msg->channel).len,1,3,0x18bb68,0x18bb68);
    key_00.small = local_158.tv_sec._4_1_;
    key_00.frozen = local_158.tv_sec._5_1_;
    key_00.ref = (uint)local_158.tv_sec;
    key_00.reserved[0] = local_158.tv_sec._6_1_;
    key_00.reserved[1] = local_158.tv_sec._7_1_;
    key_00.reserved[6] = local_158.tv_nsec._4_1_;
    key_00.reserved[7] = local_158.tv_nsec._5_1_;
    key_00.reserved[2] = (undefined1)local_158.tv_nsec;
    key_00.reserved[3] = local_158.tv_nsec._1_1_;
    key_00.reserved[4] = local_158.tv_nsec._2_1_;
    key_00.reserved[5] = local_158.tv_nsec._3_1_;
    key_00.reserved[8] = local_158.tv_nsec._6_1_;
    key_00.reserved[9] = local_158.tv_nsec._7_1_;
    key_00.capa._4_4_ = uStack_144;
    key_00.capa._0_4_ = local_148;
    key_00.len = sStack_140;
    key_00.dealloc = local_138;
    key_00.data = pcStack_130;
    fio_sub_hash_insert(&pr->patterns,uVar12,key_00,psVar15,ppsVar18);
LAB_0013d29e:
    LOCK();
    pr->lock = '\0';
    UNLOCK();
switchD_0013cbee_default:
    return;
  case 7:
    local_118 = 0;
    uVar21 = 0;
    uVar22 = 0;
    sVar5 = (pr->msg->channel).len;
    pcVar6 = (pr->msg->channel).data;
    LOCK();
    fVar3 = pr->lock;
    pr->lock = '\x01';
    UNLOCK();
    local_158.tv_sec._0_4_ = CONCAT31(local_158.tv_sec._1_3_,fVar3);
    if (fVar3 != '\0') {
      do {
        local_158.tv_sec._0_4_ = 0;
        local_158.tv_sec._4_2_ = 0;
        local_158.tv_sec._6_2_ = 0;
        local_158.tv_nsec._0_4_ = 1;
        local_158.tv_nsec._4_2_ = 0;
        local_158.tv_nsec._6_2_ = 0;
        nanosleep(&local_158,(timespec *)0x0);
        LOCK();
        fVar3 = pr->lock;
        pr->lock = '\x01';
        UNLOCK();
        local_158.tv_sec._0_4_ = CONCAT31(local_158.tv_sec._1_3_,fVar3);
      } while (fVar3 != '\0');
    }
    uVar12 = fio_siphash_xy((pr->msg->channel).data,(pr->msg->channel).len,1,3,0x18bb68,0x18bb68);
    local_158.tv_nsec._6_2_ = uVar22;
    local_158.tv_sec._0_4_ = local_118;
    local_158.tv_sec._4_2_ = 0;
    local_158.tv_sec._6_2_ = (undefined2)uVar21;
    local_158.tv_nsec._0_4_ = (undefined4)((ulong)uVar21 >> 0x10);
    local_158.tv_nsec._4_2_ = (undefined2)((ulong)uVar21 >> 0x30);
    local_148 = 0;
    uStack_144 = 0;
    local_138 = fio_free;
    local_128 = 0;
    obj.key.small = '\0';
    obj.key.frozen = '\0';
    obj.key.ref = local_118;
    obj.key.reserved[0] = local_158.tv_sec._6_1_;
    obj.key.reserved[1] = local_158.tv_sec._7_1_;
    uVar11 = (undefined6)((ulong)uVar21 >> 0x10);
    obj.key.reserved[8] = (char)local_158.tv_nsec._6_2_;
    obj.key.reserved[9] = (char)((ushort)local_158.tv_nsec._6_2_ >> 8);
    obj.key.reserved[2] = (char)uVar11;
    obj.key.reserved[3] = (char)((uint6)uVar11 >> 8);
    obj.key.reserved[4] = (char)((uint6)uVar11 >> 0x10);
    obj.key.reserved[5] = (char)((uint6)uVar11 >> 0x18);
    obj.key.reserved[6] = (char)((uint6)uVar11 >> 0x20);
    obj.key.reserved[7] = (char)((uint6)uVar11 >> 0x28);
    obj.key.capa = 0;
    obj.key.len = sVar5;
    obj.key.dealloc = fio_free;
    obj.key.data = pcVar6;
    obj.obj = (subscription_s *)0x0;
    sStack_140 = sVar5;
    pcStack_130 = pcVar6;
    pfVar13 = fio_sub_hash__find_map_pos_(&pr->patterns,uVar12,obj);
    if ((pfVar13 != (fio_sub_hash__map_s_ *)0x0) &&
       (pfVar16 = pfVar13->pos, pfVar16 != (fio_sub_hash__ordered_s_ *)0x0)) {
      LOCK();
      pfVar2 = &pfVar16->obj;
      uVar4 = (pfVar2->key).ref;
      (pfVar2->key).ref = (pfVar2->key).ref - 1;
      UNLOCK();
      if (uVar4 == 0) {
        if (((pfVar16->obj).key.small == '\0') &&
           (p_Var7 = (pfVar16->obj).key.dealloc, p_Var7 != (_func_void_void_ptr *)0x0)) {
          (*p_Var7)((pfVar16->obj).key.data);
        }
        local_110 = 0;
        local_108 = 0;
        (pfVar16->obj).key.ref = 0;
        (pfVar16->obj).key.small = '\x01';
        memcpy(&(pfVar16->obj).key.frozen,&local_108,0x2b);
      }
      fio_unsubscribe((pfVar13->pos->obj).obj);
      (pr->patterns).count = (pr->patterns).count - 1;
      pfVar8 = pfVar13->pos;
      pfVar8->hash = 0;
      uVar14 = (pr->patterns).pos;
      pfVar16 = (pr->patterns).ordered;
      if (pfVar8 == pfVar16 + (uVar14 - 1)) {
        pfVar13->hash = 0;
        pfVar16 = pfVar16 + (uVar14 - 2);
        do {
          if (uVar14 == 1) {
            uVar14 = 0;
            break;
          }
          uVar14 = uVar14 - 1;
          puVar1 = &pfVar16->hash;
          pfVar16 = pfVar16 + -1;
        } while (*puVar1 == 0);
        (pr->patterns).pos = uVar14;
      }
      pfVar13->pos = (fio_sub_hash__ordered_s_ *)0x0;
    }
LAB_0013d2d7:
    LOCK();
    pr->lock = '\0';
    UNLOCK();
  default:
    goto switchD_0013cbee_default;
  }
  pfVar9 = pr->msg;
  LOCK();
  puVar1 = &pfVar9->ref;
  *puVar1 = *puVar1 + 1;
  UNLOCK();
  fio_publish2process(pfVar9);
  return;
}

Assistant:

static void fio_cluster_server_handler(struct cluster_pr_s *pr) {
  /* what to do? */
  // fprintf(stderr, "-");
  switch ((fio_cluster_message_type_e)pr->type) {

  case FIO_CLUSTER_MSG_FORWARD: /* fallthrough */
  case FIO_CLUSTER_MSG_JSON: {
    fio_cluster_server_sender(fio_msg_internal_dup(pr->msg), pr->uuid);
    fio_publish2process(fio_msg_internal_dup(pr->msg));
    break;
  }

  case FIO_CLUSTER_MSG_PUBSUB_SUB: {
    subscription_s *s =
        fio_subscribe(.on_message = fio_mock_on_message, .match = NULL,
                      .channel = pr->msg->channel);
    fio_str_s tmp = FIO_STR_INIT_EXISTING(
        pr->msg->channel.data, pr->msg->channel.len, 0); // don't free
    fio_lock(&pr->lock);
    fio_sub_hash_insert(&pr->pubsub,
                        FIO_HASH_FN(pr->msg->channel.data, pr->msg->channel.len,
                                    &fio_postoffice.pubsub,
                                    &fio_postoffice.pubsub),
                        tmp, s, NULL);
    fio_unlock(&pr->lock);
    break;
  }
  case FIO_CLUSTER_MSG_PUBSUB_UNSUB: {
    fio_str_s tmp = FIO_STR_INIT_EXISTING(
        pr->msg->channel.data, pr->msg->channel.len, 0); // don't free
    fio_lock(&pr->lock);
    fio_sub_hash_remove(&pr->pubsub,
                        FIO_HASH_FN(pr->msg->channel.data, pr->msg->channel.len,
                                    &fio_postoffice.pubsub,
                                    &fio_postoffice.pubsub),
                        tmp, NULL);
    fio_unlock(&pr->lock);
    break;
  }

  case FIO_CLUSTER_MSG_PATTERN_SUB: {
    uintptr_t match = fio_str2u64(pr->msg->data.data);
    subscription_s *s = fio_subscribe(.on_message = fio_mock_on_message,
                                      .match = (fio_match_fn)match,
                                      .channel = pr->msg->channel);
    fio_str_s tmp = FIO_STR_INIT_EXISTING(
        pr->msg->channel.data, pr->msg->channel.len, 0); // don't free
    fio_lock(&pr->lock);
    fio_sub_hash_insert(&pr->patterns,
                        FIO_HASH_FN(pr->msg->channel.data, pr->msg->channel.len,
                                    &fio_postoffice.pubsub,
                                    &fio_postoffice.pubsub),
                        tmp, s, NULL);
    fio_unlock(&pr->lock);
    break;
  }

  case FIO_CLUSTER_MSG_PATTERN_UNSUB: {
    fio_str_s tmp = FIO_STR_INIT_EXISTING(
        pr->msg->channel.data, pr->msg->channel.len, 0); // don't free
    fio_lock(&pr->lock);
    fio_sub_hash_remove(&pr->patterns,
                        FIO_HASH_FN(pr->msg->channel.data, pr->msg->channel.len,
                                    &fio_postoffice.pubsub,
                                    &fio_postoffice.pubsub),
                        tmp, NULL);
    fio_unlock(&pr->lock);
    break;
  }

  case FIO_CLUSTER_MSG_ROOT_JSON:
    pr->type = FIO_CLUSTER_MSG_JSON; /* fallthrough */
  case FIO_CLUSTER_MSG_ROOT:
    fio_publish2process(fio_msg_internal_dup(pr->msg));
    break;

  case FIO_CLUSTER_MSG_SHUTDOWN: /* fallthrough */
  case FIO_CLUSTER_MSG_ERROR:    /* fallthrough */
  case FIO_CLUSTER_MSG_PING:     /* fallthrough */
  default:
    break;
  }
}